

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int DisconnectP33xx(P33X *pP33x)

{
  int iVar1;
  char *__s;
  long lVar2;
  
  lVar2 = 0;
  while ((P33X *)addrsP33x[lVar2] != pP33x) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x10) {
      return 1;
    }
  }
  iVar1 = CloseRS232Port(&pP33x->RS232Port);
  __s = "P33x disconnected.";
  if (iVar1 != 0) {
    __s = "P33x disconnection failed.";
  }
  puts(__s);
  if (iVar1 != 0) {
    return (uint)(iVar1 != 0);
  }
  addrsP33x[lVar2] = (void *)0x0;
  return 0;
}

Assistant:

HARDWAREX_API int DisconnectP33xx(P33X* pP33x)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsP33x[id] != pP33x)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectP33x(pP33x);
	if (res != EXIT_SUCCESS) return res;

	addrsP33x[id] = NULL;

	return EXIT_SUCCESS;
}